

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmax_distance.cpp
# Opt level: O0

void __thiscall KMaxDistance::copyVals(KMaxDistance *this,MaxRec *src,MaxRec *dst)

{
  long in_RDX;
  long in_RSI;
  int i;
  int local_1c;
  
  if (*(int *)(in_RSI + 0x30) != *(int *)(in_RDX + 0x30)) {
    fprintf(_stderr,"ERROR: size mismatch in copyVals.\n");
    exit(1);
  }
  for (local_1c = 0; local_1c < *(int *)(in_RSI + 0x30); local_1c = local_1c + 1) {
    *(undefined8 *)(in_RDX + 0x38 + (long)local_1c * 8) =
         *(undefined8 *)(in_RSI + 0x38 + (long)local_1c * 8);
  }
  *(undefined8 *)(in_RDX + 0x28) = *(undefined8 *)(in_RSI + 0x28);
  return;
}

Assistant:

void KMaxDistance::copyVals( const MaxRec *src, MaxRec *dst ){
    if ( src->numVals != dst->numVals ){ fprintf(stderr, "ERROR: size mismatch in copyVals.\n"); exit(1); }
    for ( int i = 0; i < src->numVals; ++i ) dst->vals[i] = src->vals[i];
    dst->sumVals = src->sumVals;
}